

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_font.cpp
# Opt level: O3

void __thiscall FSingleLumpFont::LoadTranslations(FSingleLumpFont *this)

{
  int iVar1;
  long *plVar2;
  BYTE *pBVar3;
  bool bVar4;
  PalEntry *identity_00;
  long lVar5;
  PalEntry *palette;
  int iVar6;
  BYTE identity [256];
  PalEntry local_palette [256];
  double luminosity [256];
  TranslationParm *local_d40;
  PalEntry local_d38 [64];
  PalEntry local_c38 [256];
  double local_838 [257];
  
  iVar1 = (this->super_FFont).FirstChar;
  iVar6 = (this->super_FFont).LastChar;
  if (this->FontType - FONT2 < 2) {
    FixupPalette(this,(BYTE *)local_d38,local_838,this->PaletteData,this->RescalePalette,local_c38);
    bVar4 = true;
    local_d40 = TranslationParms[0].Array;
  }
  else {
    if (this->FontType != FONT1) {
      I_Error("Unknown font type in FSingleLumpFont::LoadTranslation.");
      return;
    }
    local_d40 = TranslationParms[1].Array;
    CheckFON1Chars(this,local_838);
    bVar4 = false;
  }
  iVar6 = iVar6 + 1;
  if (iVar6 != iVar1) {
    iVar6 = iVar6 - iVar1;
    lVar5 = 0;
    do {
      plVar2 = *(long **)((long)&((this->super_FFont).Chars)->Pic + lVar5);
      if (plVar2 != (long *)0x0) {
        pBVar3 = (this->super_FFont).PatchRemap;
        (**(code **)(*plVar2 + 0x48))(plVar2);
        plVar2[0xe] = (long)pBVar3;
      }
      lVar5 = lVar5 + 0x10;
    } while ((ulong)(iVar6 + (uint)(iVar6 == 0)) << 4 != lVar5);
  }
  identity_00 = local_d38;
  if (!bVar4) {
    identity_00 = (PalEntry *)0x0;
  }
  palette = local_c38;
  if (!bVar4) {
    palette = (PalEntry *)0x0;
  }
  FFont::BuildTranslations
            (&this->super_FFont,local_838,(BYTE *)identity_00,local_d40,
             (this->super_FFont).ActiveColors,palette);
  return;
}

Assistant:

void FSingleLumpFont::LoadTranslations()
{
	double luminosity[256];
	BYTE identity[256];
	PalEntry local_palette[256];
	bool useidentity = true;
	bool usepalette = false;
	const void* ranges;
	unsigned int count = LastChar - FirstChar + 1;

	switch(FontType)
	{
		case FONT1:
			useidentity = false;
			ranges = &TranslationParms[1][0];
			CheckFON1Chars (luminosity);
			break;

		case BMFFONT:
		case FONT2:
			usepalette = true;
			FixupPalette (identity, luminosity, PaletteData, RescalePalette, local_palette);

			ranges = &TranslationParms[0][0];
			break;

		default:
			// Should be unreachable.
			I_Error("Unknown font type in FSingleLumpFont::LoadTranslation.");
			return;
	}

	for(unsigned int i = 0;i < count;++i)
	{
		if(Chars[i].Pic)
			static_cast<FFontChar2*>(Chars[i].Pic)->SetSourceRemap(PatchRemap);
	}

	BuildTranslations (luminosity, useidentity ? identity : NULL, ranges, ActiveColors, usepalette ? local_palette : NULL);
}